

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int queue_5_3::enQueue(sq_queue *q,int e)

{
  allocator local_41;
  string local_40 [36];
  int local_1c;
  sq_queue *psStack_18;
  int e_local;
  sq_queue *q_local;
  
  if (q->front == (q->rear + 1) % q->ssize) {
    local_1c = e;
    psStack_18 = q;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,anon_var_dwarf_7d1,&local_41);
    q_local._4_4_ = errCode((string *)local_40,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    q->data[q->rear] = e;
    q->rear = (q->rear + 1) % q->ssize;
    q_local._4_4_ = 1;
  }
  return q_local._4_4_;
}

Assistant:

int enQueue(sq_queue &q, int e) {
        if (q.front == (q.rear + 1) % q.ssize)
            return errCode("满队", 0);
        q.data[q.rear] = e;
        q.rear = (q.rear + 1) % q.ssize;
        return 1;
    }